

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int parse_miniscript(char *miniscript,char **key_name_array,char **key_value_array,size_t array_len,
                    uint32_t flags,uint32_t target,uint32_t *network,uint32_t descriptor_depth,
                    uint32_t descriptor_index,wally_descriptor_script_item *script_item,
                    size_t item_len,uint32_t *properties,char **script_ignore_checksum)

{
  int iVar1;
  uchar *puVar2;
  miniscript_node_t *pmStack_78;
  _Bool is_tapscript;
  miniscript_node_t *top_node;
  size_t write_len;
  size_t temp_script_len;
  uchar *temp_script;
  size_t work_script_len;
  uchar *work_script;
  size_t index;
  uint32_t local_38;
  int ret;
  uint32_t target_local;
  uint32_t flags_local;
  size_t array_len_local;
  char **key_value_array_local;
  char **key_name_array_local;
  char *miniscript_local;
  
  work_script_len = 0;
  temp_script = (uchar *)0x0;
  temp_script_len = 0;
  write_len = 0;
  pmStack_78 = (miniscript_node_t *)0x0;
  if ((((((flags & 0xfffffffe) == 0) && (miniscript != (char *)0x0)) &&
       ((array_len == 0 || ((key_name_array != (char **)0x0 && (key_value_array != (char **)0x0)))))
       ) && ((array_len != 0 ||
             ((key_name_array == (char **)0x0 && (key_value_array == (char **)0x0)))))) &&
     (local_38 = target, ret = flags, _target_local = (uchar *)array_len,
     array_len_local = (size_t)key_value_array, key_value_array_local = key_name_array,
     key_name_array_local = (char **)miniscript, iVar1 = check_ascii_string(miniscript,1000000),
     iVar1 == 0)) {
    if (_target_local != (uchar *)0x0) {
      for (work_script = (uchar *)0x0; work_script < _target_local; work_script = work_script + 1) {
        if ((key_value_array_local[(long)work_script] == (char *)0x0) ||
           (*(long *)(array_len_local + (long)work_script * 8) == 0)) {
          return -2;
        }
        iVar1 = check_ascii_string(key_value_array_local[(long)work_script],0x10);
        if ((iVar1 != 0) ||
           (iVar1 = check_ascii_string(*(char **)(array_len_local + (long)work_script * 8),0x82),
           iVar1 != 0)) {
          return -2;
        }
      }
    }
    index._4_4_ = analyze_miniscript((char *)key_name_array_local,key_value_array_local,
                                     (char **)array_len_local,(size_t)_target_local,local_38,network
                                     ,ret,(miniscript_node_t *)0x0,(miniscript_node_t *)0x0,
                                     &stack0xffffffffffffff88,script_ignore_checksum);
    if (((index._4_4_ == 0) && ((local_38 & 2) != 0)) &&
       ((pmStack_78->info == (miniscript_item_t *)0x0 || ((pmStack_78->info->kind & 2U) == 0)))) {
      index._4_4_ = -2;
    }
    if ((index._4_4_ == 0) && (script_item != (wally_descriptor_script_item *)0x0)) {
      for (work_script = (uchar *)0x0; work_script < item_len; work_script = work_script + 1) {
        top_node = (miniscript_node_t *)0x0;
        temp_script_len = (size_t)script_item[(long)work_script].script;
        write_len = script_item[(long)work_script].script_len;
        if ((uchar *)temp_script_len == (uchar *)0x0) {
          if (work_script_len == 0) {
            work_script_len = (size_t)wally_malloc(1000000);
            if ((void *)work_script_len == (void *)0x0) {
              index._4_4_ = -3;
              break;
            }
            temp_script = (uchar *)0xf4240;
          }
          temp_script_len = work_script_len;
          write_len = (size_t)temp_script;
        }
        index._4_4_ = convert_script_from_node
                                (pmStack_78,script_item[(long)work_script].child_num,
                                 descriptor_depth,descriptor_index,(uchar *)temp_script_len,
                                 write_len,(size_t *)&top_node);
        if (index._4_4_ != 0) break;
        if (script_item[(long)work_script].script == (uchar *)0x0) {
          puVar2 = (uchar *)wally_malloc((size_t)top_node);
          script_item[(long)work_script].script = puVar2;
          if (script_item[(long)work_script].script == (uchar *)0x0) {
            index._4_4_ = -3;
            break;
          }
          memcpy(script_item[(long)work_script].script,(void *)temp_script_len,(size_t)top_node);
        }
        script_item[(long)work_script].script_len = (size_t)top_node;
      }
    }
    if ((index._4_4_ == 0) && (properties != (uint32_t *)0x0)) {
      *properties = pmStack_78->type_properties;
    }
    if ((index._4_4_ != 0) && (script_ignore_checksum != (char **)0x0)) {
      wally_free_string(*script_ignore_checksum);
    }
    if (work_script_len != 0) {
      wally_bzero((void *)work_script_len,(size_t)temp_script);
      wally_free((void *)work_script_len);
    }
    free_miniscript_node(pmStack_78);
    miniscript_local._4_4_ = index._4_4_;
  }
  else {
    miniscript_local._4_4_ = -2;
  }
  return miniscript_local._4_4_;
}

Assistant:

static int parse_miniscript(
    const char *miniscript,
    const char **key_name_array,
    const char **key_value_array,
    size_t array_len,
    uint32_t flags,
    uint32_t target,
    uint32_t *network,
    uint32_t descriptor_depth,
    uint32_t descriptor_index,
    struct wally_descriptor_script_item *script_item,
    size_t item_len,
    uint32_t *properties,
    char **script_ignore_checksum)
{
    int ret;
    size_t index;
    unsigned char *work_script = NULL;
    size_t work_script_len = 0;
    unsigned char *temp_script = NULL;
    size_t temp_script_len = 0;
    size_t write_len;
    struct miniscript_node_t *top_node = NULL;
    bool is_tapscript = false;

    if (((flags & ~0x1) != 0) ||
        !miniscript || (array_len && (!key_name_array || !key_value_array)) ||
        (!array_len && (key_name_array || key_value_array)) ||
        check_ascii_string(miniscript, DESCRIPTOR_LIMIT_LENGTH))
        return WALLY_EINVAL;

    if (array_len) {
        for (index = 0; index < array_len; ++index) {
            if (!key_name_array[index] || !key_value_array[index])
                return WALLY_EINVAL;
            if (check_ascii_string(key_name_array[index], DESCRIPTOR_KEY_NAME_MAX_LENGTH) ||
                check_ascii_string(key_value_array[index], DESCRIPTOR_KEY_VALUE_MAX_LENGTH)) {
                return WALLY_EINVAL;
            }
        }
    }

    ret = analyze_miniscript(miniscript, key_name_array, key_value_array, array_len,
                             target, network, flags,
                             NULL, NULL, &top_node, script_ignore_checksum);
    if ((ret == WALLY_OK) && (target & DESCRIPTOR_KIND_DESCRIPTOR) &&
        (!top_node->info || !(top_node->info->kind & DESCRIPTOR_KIND_DESCRIPTOR)))
        ret = WALLY_EINVAL;
    if ((ret == WALLY_OK) && script_item) {
        for (index = 0; index < item_len; ++index) {
            write_len = 0;

            temp_script = script_item[index].script;
            temp_script_len = script_item[index].script_len;
            if (!temp_script) {
                if (!work_script) {
                    work_script = (unsigned char *)wally_malloc(DESCRIPTOR_LIMIT_LENGTH);
                    if (!work_script) {
                        ret = WALLY_ENOMEM;
                        break;
                    }
                    work_script_len = DESCRIPTOR_LIMIT_LENGTH;
                }
                temp_script = work_script;
                temp_script_len = work_script_len;
            }
            ret = convert_script_from_node(top_node, script_item[index].child_num,
                                           descriptor_depth, descriptor_index,
                                           temp_script, temp_script_len,
                                           &write_len);
            if (ret != WALLY_OK)
                break;
            if (!script_item[index].script) {
                script_item[index].script = (unsigned char *)wally_malloc(write_len);
                if (!script_item[index].script) {
                    ret = WALLY_ENOMEM;
                    break;
                }
                memcpy(script_item[index].script, temp_script, write_len);
            }
            script_item[index].script_len = write_len;
        }
    }
    if ((ret == WALLY_OK) && properties)
        *properties = top_node->type_properties;

    if ((ret != WALLY_OK) && script_ignore_checksum)
        wally_free_string(*script_ignore_checksum);
    if (work_script) {
        wally_bzero(work_script, work_script_len);
        wally_free(work_script);
    }
    free_miniscript_node(top_node);
    return ret;
}